

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManCounterExampleValueTest(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  uint Id;
  uint uVar1;
  void *pvVar2;
  int iVar3;
  
  pvVar2 = Vec_PtrEntry(pAig->vObjs,pAig->vObjs->nSize / 2);
  iVar3 = 1;
  if (1 < pCex->iFrame) {
    iVar3 = pCex->iFrame;
  }
  printf("\nUsing counter-example, which asserts output %d in frame %d.\n",(ulong)(uint)pCex->iPo);
  Aig_ManCounterExampleValueStart(pAig,pCex);
  Id = *(uint *)((long)pvVar2 + 0x24);
  uVar1 = Aig_ManCounterExampleValueLookup(pAig,Id,iVar3 - 1U);
  printf("Value of object %d in frame %d is %d.\n",(ulong)Id,(ulong)(iVar3 - 1U),(ulong)uVar1);
  Aig_ManCounterExampleValueStop(pAig);
  return;
}

Assistant:

void Aig_ManCounterExampleValueTest( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj = Aig_ManObj( pAig, Aig_ManObjNumMax(pAig)/2 );
    int iFrame = Abc_MaxInt( 0, pCex->iFrame - 1 );
    printf( "\nUsing counter-example, which asserts output %d in frame %d.\n", pCex->iPo, pCex->iFrame );
    Aig_ManCounterExampleValueStart( pAig, pCex );
    printf( "Value of object %d in frame %d is %d.\n", Aig_ObjId(pObj), iFrame,
        Aig_ManCounterExampleValueLookup(pAig, Aig_ObjId(pObj), iFrame) );
    Aig_ManCounterExampleValueStop( pAig );
}